

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

hugeint_t duckdb::DecimalScaleDownOperator::Operation<int,duckdb::hugeint_t>
                    (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  int iVar2;
  uint input_00;
  undefined1 auVar3 [12];
  hugeint_t result;
  hugeint_t local_48;
  string local_38;
  
  iVar2 = input / (*(int *)((long)dataptr + 0x24) / 2);
  input_00 = (int)((iVar2 >> 0x1f | 1U) + iVar2) / 2;
  bVar1 = TryCast::Operation<int,duckdb::hugeint_t>(input_00,&local_48,false);
  if (bVar1) {
    return local_48;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<int,duckdb::hugeint_t>(&local_38,(duckdb *)(ulong)input_00,auVar3._8_4_);
  InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}